

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

void diy::Serialization<std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>_>::load
               (BinaryBuffer *bb,Vector *v)

{
  Bounds<int> *in_RSI;
  size_t s;
  unsigned_long *in_stack_ffffffffffffff38;
  BinaryBuffer *in_stack_ffffffffffffff40;
  Bounds<int> *this;
  Bounds<int> *x;
  BinaryBuffer *bb_00;
  value_type *in_stack_ffffffffffffff60;
  BinaryBuffer in_stack_ffffffffffffff68;
  vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *in_stack_ffffffffffffff70;
  Bounds<int> *local_18;
  
  load<unsigned_long>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  bb_00 = (BinaryBuffer *)&stack0xffffffffffffff68;
  this = in_RSI;
  x = local_18;
  Bounds<int>::Bounds((Bounds<int> *)0x1732b5);
  std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::resize
            (in_stack_ffffffffffffff70,(size_type)in_stack_ffffffffffffff68._vptr_BinaryBuffer,
             in_stack_ffffffffffffff60);
  Bounds<int>::~Bounds(this);
  if (local_18 != (Bounds<int> *)0x0) {
    std::vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_>::operator[]
              ((vector<diy::Bounds<int>,_std::allocator<diy::Bounds<int>_>_> *)in_RSI,0);
    load<diy::Bounds<int>>(bb_00,x,(size_t)this);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }